

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef lj_opt_narrow_arith(jit_State *J,TRef rb,TRef rc,TValue *vb,TValue *vc,IROp op)

{
  TRef TVar1;
  TRef TVar2;
  ushort uVar3;
  double dVar4;
  
  TVar1 = conv_str_tonum(J,rb,vb);
  TVar2 = conv_str_tonum(J,rc,vc);
  if (((op - IR_ADD < 2) && ((TVar1 >> 0x18 & 0x1f) - 0xf < 5)) &&
     ((TVar2 >> 0x18 & 0x1f) - 0xf < 5)) {
    dVar4 = lj_vm_foldarith(vb->n,vc->n,op - IR_ADD);
    if ((dVar4 == (double)(int)dVar4) && (!NAN(dVar4) && !NAN((double)(int)dVar4))) {
      uVar3 = (short)(op << 8) + 0xc93;
      goto LAB_0012a185;
    }
  }
  if ((TVar1 & 0x1f000000) != 0xe000000) {
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
    TVar1 = lj_opt_fold(J);
  }
  if ((TVar2 & 0x1f000000) != 0xe000000) {
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
    TVar2 = lj_opt_fold(J);
  }
  uVar3 = (ushort)(op << 8) | 0xe;
LAB_0012a185:
  (J->fold).ins.field_0.ot = uVar3;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar1 = lj_opt_fold(J);
  return TVar1;
}

Assistant:

TRef lj_opt_narrow_arith(jit_State *J, TRef rb, TRef rc,
			 TValue *vb, TValue *vc, IROp op)
{
  rb = conv_str_tonum(J, rb, vb);
  rc = conv_str_tonum(J, rc, vc);
  /* Must not narrow MUL in non-DUALNUM variant, because it loses -0. */
  if ((op >= IR_ADD && op <= (LJ_DUALNUM ? IR_MUL : IR_SUB)) &&
      tref_isinteger(rb) && tref_isinteger(rc) &&
      numisint(lj_vm_foldarith(numberVnum(vb), numberVnum(vc),
			       (int)op - (int)IR_ADD)))
    return emitir(IRTGI((int)op - (int)IR_ADD + (int)IR_ADDOV), rb, rc);
  if (!tref_isnum(rb)) rb = emitir(IRTN(IR_CONV), rb, IRCONV_NUM_INT);
  if (!tref_isnum(rc)) rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
  return emitir(IRTN(op), rb, rc);
}